

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_destroy(void *self)

{
  nn_ctcp *ctcp;
  
  nn_dns_term((nn_dns *)0x1ec024);
  nn_stcp_term((nn_stcp *)0x1ec035);
  nn_backoff_term((nn_backoff *)0x1ec046);
  nn_usock_term((nn_usock *)0x1ec054);
  nn_fsm_term((nn_fsm *)0x1ec05e);
  nn_free((void *)0x1ec068);
  return;
}

Assistant:

static void nn_ctcp_destroy (void *self)
{
    struct nn_ctcp *ctcp = self;

    nn_dns_term (&ctcp->dns);
    nn_stcp_term (&ctcp->stcp);
    nn_backoff_term (&ctcp->retry);
    nn_usock_term (&ctcp->usock);
    nn_fsm_term (&ctcp->fsm);

    nn_free (ctcp);
}